

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O1

RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> * __thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::set
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,int *key,
          WeightedGraphAdjSet<int,_int> *value)

{
  int iVar1;
  int iVar2;
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this_00;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar3;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar4;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar5;
  size_t sVar6;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node_3;
  EVP_PKEY_CTX *ctx;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node_2;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node_1;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node;
  TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_> local_80;
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *local_40;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *local_38;
  
  local_40 = this;
  if (this->_root ==
      (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
       *)0x0) {
    pRVar3 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)operator_new(0x70);
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::TreeElement
              (&local_80,key,value);
    pRVar3->_vptr_RBTreeNode = (_func_int **)&PTR__RBTreeNode_0010d958;
    WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet(&(pRVar3->element).value);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::_init(pRVar3,(EVP_PKEY_CTX *)key);
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::operator=
              (&pRVar3->element,&local_80);
    this->_root = pRVar3;
    local_80.value._vptr_WeightedGraphAdjSet = (_func_int **)&PTR__WeightedGraphAdjSet_0010d988;
    local_80.value._table._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010d9b8;
    while (pLVar4 = local_80.value._table._list._header,
          local_80.value._table._list._header != local_80.value._table._list._tail) {
      pLVar5 = (local_80.value._table._list._header)->_next;
      if (pLVar5 != (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                     *)0x0) {
        (local_80.value._table._list._header)->_next = pLVar5->_next;
        (*pLVar5->_vptr_ListNode[1])(pLVar5);
      }
      if (pLVar5 == local_80.value._table._list._tail) {
        local_80.value._table._list._tail = pLVar4;
      }
      local_80.value._table._list._size = local_80.value._table._list._size - 1;
    }
    local_80.value._table._list._size = 0;
    local_80.value._table._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010d9e8;
    if (local_80.value._table._list._header !=
        (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
         *)0x0) {
      (*(local_80.value._table._list._header)->_vptr_ListNode[1])
                (local_80.value._table._list._header);
    }
  }
  else {
    pRVar3 = this->_root;
    do {
      node = pRVar3;
      iVar1 = (node->element).key;
      if (iVar1 == *key) {
        (node->element).value._vertex = value->_vertex;
        pLVar4 = (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                  *)operator_new(0x38);
        pLVar4->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010da18;
        (pLVar4->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010da48
        ;
        pLVar4->_next =
             (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
              *)0x0;
        (pLVar4->element).value.from =
             (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)0x0;
        (pLVar4->element).value.to =
             (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)0x0;
        (pLVar4->element).value.weight = 0;
        (node->element).value._table._list._header = pLVar4;
        (node->element).value._table._list._tail = pLVar4;
        (node->element).value._table._list._size = 0;
        pLVar4 = (value->_table)._list._header;
        if ((value->_table)._list._tail == pLVar4) {
          return local_40;
        }
        sVar6 = 1;
        do {
          pLVar4 = pLVar4->_next;
          local_38 = (node->element).value._table._list._tail;
          pLVar5 = (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                    *)operator_new(0x38);
          pLVar5->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010da18;
          (pLVar5->element)._vptr_SymbolTableElement =
               (_func_int **)&PTR__SymbolTableElement_0010da48;
          (pLVar5->element).value.from =
               (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
          (pLVar5->element).value.to =
               (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
          (pLVar5->element).value.weight = 0;
          (pLVar5->element).key = (pLVar4->element).key;
          (pLVar5->element).value.from = (pLVar4->element).value.from;
          (pLVar5->element).value.to = (pLVar4->element).value.to;
          (pLVar5->element).value.weight = (pLVar4->element).value.weight;
          pLVar5->_next =
               (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                *)0x0;
          pLVar5->_next = local_38->_next;
          local_38->_next = pLVar5;
          (node->element).value._table._list._size = sVar6;
          (node->element).value._table._list._tail = pLVar5;
          sVar6 = sVar6 + 1;
        } while ((value->_table)._list._tail != pLVar4);
        return local_40;
      }
      pRVar3 = (&node->_left)[iVar1 <= *key];
    } while ((&node->_left)[iVar1 <= *key] !=
             (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)0x0);
    pRVar3 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)operator_new(0x70);
    ctx = (EVP_PKEY_CTX *)key;
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::TreeElement
              (&local_80,key,value);
    pRVar3->_vptr_RBTreeNode = (_func_int **)&PTR__RBTreeNode_0010d958;
    WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet(&(pRVar3->element).value);
    RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
    ::_init(pRVar3,ctx);
    TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::operator=
              (&pRVar3->element,&local_80);
    local_80.value._vptr_WeightedGraphAdjSet = (_func_int **)&PTR__WeightedGraphAdjSet_0010d988;
    local_80.value._table._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010d9b8;
    while (pLVar4 = local_80.value._table._list._header,
          local_80.value._table._list._header != local_80.value._table._list._tail) {
      pLVar5 = (local_80.value._table._list._header)->_next;
      if (pLVar5 != (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                     *)0x0) {
        (local_80.value._table._list._header)->_next = pLVar5->_next;
        (*pLVar5->_vptr_ListNode[1])(pLVar5);
      }
      if (pLVar5 == local_80.value._table._list._tail) {
        local_80.value._table._list._tail = pLVar4;
      }
      local_80.value._table._list._size = local_80.value._table._list._size - 1;
    }
    local_80.value._table._list._size = 0;
    local_80.value._table._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010d9e8;
    if (local_80.value._table._list._header !=
        (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
         *)0x0) {
      (*(local_80.value._table._list._header)->_vptr_ListNode[1])
                (local_80.value._table._list._header);
    }
    this_00 = local_40;
    local_80.value._table._list._header =
         (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
          *)0x0;
    local_80.value._table._list._tail =
         (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
          *)0x0;
    local_80.value._table._list._size = 0;
    iVar2 = *key;
    iVar1 = (node->element).key;
    pRVar3->_parent = node;
    pRVar3->_is_left = iVar2 < iVar1;
    pRVar3->_is_red = true;
    (&node->_left)[iVar1 <= iVar2] = pRVar3;
    do {
      node->node_count = node->node_count + 1;
      pRVar3 = _balance(this_00,node);
      node = pRVar3->_parent;
    } while (node != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                      *)0x0);
    pRVar3 = this_00->_root;
    if (pRVar3->_is_red == true) {
      pRVar3->_is_red = false;
    }
  }
  return local_40;
}

Assistant:

inline
    RBTree<Key, Value>& RBTree<Key, Value>::set(const Key &key, const Value &value){
        if (isEmpty()) {
            _root = new RBTreeNode<TreeElement<Key, Value>>(TreeElement<Key, Value>(key, value));
            return *this;
        }
        auto node = _root;
        auto parent = _root->parent();
        while (node != nullptr) {
            if (node->element.key == key) {
                node->element.value = value;
                return *this;
            }
            parent = node;
            if (key < node->element.key) {
                node = node->left();
            } else {
                node = node->right();
            }
        }
        node = new RBTreeNode<TreeElement<Key, Value>>(TreeElement<Key, Value>(key, value));
        if (key < parent->element.key) {
            parent->insertLeft(node, true);
        } else {
            parent->insertRight(node, true);
        }
        while (parent != nullptr) {
            parent->node_count++;
            parent = _balance(parent)->parent();
        }
        // reset the root's color
        if (_root->isRed()) {
            _root->flipColors();
        }
        return *this;
    }